

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clean_test.cc
# Opt level: O2

void __thiscall anon_unknown.dwarf_3e503::CleanDeadTestCleanDead::Run(CleanDeadTestCleanDead *this)

{
  State *state_00;
  VirtualFileSystem *this_00;
  BuildConfig *config;
  Test *pTVar1;
  bool bVar2;
  LoadStatus LVar3;
  int iVar4;
  LogEntry *pLVar5;
  TimeStamp TVar6;
  int iVar7;
  allocator<char> local_379;
  string local_378;
  string err;
  Cleaner cleaner2;
  Cleaner cleaner1;
  BuildLog log2;
  BuildLog log1;
  State state;
  
  State::State(&state);
  iVar4 = g_current_test->assertion_failures_;
  AssertParse(&state,
              "rule cat\n  command = cat $in > $out\nbuild out1: cat in\nbuild out2: cat in\n",
              (ManifestParserOptions)0x0);
  iVar7 = g_current_test->assertion_failures_;
  if (iVar4 == iVar7) {
    state_00 = &(this->super_CleanDeadTest).super_CleanTest.super_StateTestWithBuiltinRules.state_;
    AssertParse(state_00,"build out2: cat in\n",(ManifestParserOptions)0x0);
    iVar7 = g_current_test->assertion_failures_;
    if (iVar4 == iVar7) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&cleaner1,"in",(allocator<char> *)&log1);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&cleaner2,"",(allocator<char> *)&log2);
      this_00 = &(this->super_CleanDeadTest).super_CleanTest.fs_;
      VirtualFileSystem::Create(this_00,(string *)&cleaner1,(string *)&cleaner2);
      std::__cxx11::string::~string((string *)&cleaner2);
      std::__cxx11::string::~string((string *)&cleaner1);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&cleaner1,"out1",(allocator<char> *)&log1);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&cleaner2,"",(allocator<char> *)&log2);
      VirtualFileSystem::Create(this_00,(string *)&cleaner1,(string *)&cleaner2);
      std::__cxx11::string::~string((string *)&cleaner2);
      std::__cxx11::string::~string((string *)&cleaner1);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&cleaner1,"out2",(allocator<char> *)&log1);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&cleaner2,"",(allocator<char> *)&log2);
      VirtualFileSystem::Create(this_00,(string *)&cleaner1,(string *)&cleaner2);
      std::__cxx11::string::~string((string *)&cleaner2);
      std::__cxx11::string::~string((string *)&cleaner1);
      BuildLog::BuildLog(&log1);
      pTVar1 = g_current_test;
      err._M_dataplus._M_p = (pointer)&err.field_2;
      err._M_string_length = 0;
      err.field_2._M_local_buf[0] = '\0';
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&cleaner1,"CleanTest-tempfile",(allocator<char> *)&cleaner2);
      bVar2 = BuildLog::OpenForWrite
                        (&log1,(string *)&cleaner1,&(this->super_CleanDeadTest).super_BuildLogUser,
                         &err);
      testing::Test::Check
                (pTVar1,bVar2,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/clean_test.cc"
                 ,0x1f2,"log1.OpenForWrite(kTestFilename, *this, &err)");
      std::__cxx11::string::~string((string *)&cleaner1);
      pTVar1 = g_current_test;
      bVar2 = std::operator==("",&err);
      bVar2 = testing::Test::Check
                        (pTVar1,bVar2,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/clean_test.cc"
                         ,499,"\"\" == err");
      if (bVar2) {
        BuildLog::RecordCommand
                  (&log1,*state.edges_.super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
                          super__Vector_impl_data._M_start,0xf,0x12,0);
        BuildLog::RecordCommand
                  (&log1,state.edges_.super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
                         super__Vector_impl_data._M_start[1],0x14,0x19,0);
        BuildLog::Close(&log1);
        BuildLog::BuildLog(&log2);
        pTVar1 = g_current_test;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&cleaner1,"CleanTest-tempfile",(allocator<char> *)&cleaner2);
        LVar3 = BuildLog::Load(&log2,(string *)&cleaner1,&err);
        testing::Test::Check
                  (pTVar1,LVar3 != LOAD_ERROR,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/clean_test.cc"
                   ,0x1f9,"log2.Load(kTestFilename, &err)");
        std::__cxx11::string::~string((string *)&cleaner1);
        pTVar1 = g_current_test;
        bVar2 = std::operator==("",&err);
        bVar2 = testing::Test::Check
                          (pTVar1,bVar2,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/clean_test.cc"
                           ,0x1fa,"\"\" == err");
        if (bVar2) {
          bVar2 = testing::Test::Check
                            (g_current_test,log2.entries_._M_h._M_element_count == 2,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/clean_test.cc"
                             ,0x1fb,"2u == log2.entries().size()");
          pTVar1 = g_current_test;
          if (bVar2) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&cleaner1,"out1",(allocator<char> *)&cleaner2);
            pLVar5 = BuildLog::LookupByOutput(&log2,(string *)&cleaner1);
            bVar2 = testing::Test::Check
                              (pTVar1,pLVar5 != (LogEntry *)0x0,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/clean_test.cc"
                               ,0x1fc,"log2.LookupByOutput(\"out1\")");
            std::__cxx11::string::~string((string *)&cleaner1);
            pTVar1 = g_current_test;
            if (bVar2) {
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&cleaner1,"out2",(allocator<char> *)&cleaner2);
              pLVar5 = BuildLog::LookupByOutput(&log2,(string *)&cleaner1);
              bVar2 = testing::Test::Check
                                (pTVar1,pLVar5 != (LogEntry *)0x0,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/clean_test.cc"
                                 ,0x1fd,"log2.LookupByOutput(\"out2\")");
              std::__cxx11::string::~string((string *)&cleaner1);
              if (bVar2) {
                config = &(this->super_CleanDeadTest).super_CleanTest.config_;
                Cleaner::Cleaner(&cleaner1,&state,config,&this_00->super_DiskInterface);
                pTVar1 = g_current_test;
                iVar4 = Cleaner::CleanDead(&cleaner1,&log2.entries_);
                testing::Test::Check
                          (pTVar1,iVar4 == 0,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/clean_test.cc"
                           ,0x201,"0 == cleaner1.CleanDead(log2.entries())");
                testing::Test::Check
                          (g_current_test,cleaner1.cleaned_files_count_ == 0,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/clean_test.cc"
                           ,0x202,"0 == cleaner1.cleaned_files_count()");
                testing::Test::Check
                          (g_current_test,
                           *(size_t *)
                            ((long)&(this->super_CleanDeadTest).super_CleanTest.fs_.files_removed_.
                                    _M_t._M_impl.super__Rb_tree_header + 0x20) == 0,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/clean_test.cc"
                           ,0x203,"0u == fs_.files_removed_.size()");
                pTVar1 = g_current_test;
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&cleaner2,"in",(allocator<char> *)&local_378);
                TVar6 = VirtualFileSystem::Stat(this_00,(string *)&cleaner2,&err);
                testing::Test::Check
                          (pTVar1,TVar6 != 0,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/clean_test.cc"
                           ,0x204,"0 != fs_.Stat(\"in\", &err)");
                std::__cxx11::string::~string((string *)&cleaner2);
                pTVar1 = g_current_test;
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&cleaner2,"out1",(allocator<char> *)&local_378);
                TVar6 = VirtualFileSystem::Stat(this_00,(string *)&cleaner2,&err);
                testing::Test::Check
                          (pTVar1,TVar6 != 0,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/clean_test.cc"
                           ,0x205,"0 != fs_.Stat(\"out1\", &err)");
                std::__cxx11::string::~string((string *)&cleaner2);
                pTVar1 = g_current_test;
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&cleaner2,"out2",(allocator<char> *)&local_378);
                TVar6 = VirtualFileSystem::Stat(this_00,(string *)&cleaner2,&err);
                testing::Test::Check
                          (pTVar1,TVar6 != 0,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/clean_test.cc"
                           ,0x206,"0 != fs_.Stat(\"out2\", &err)");
                std::__cxx11::string::~string((string *)&cleaner2);
                Cleaner::Cleaner(&cleaner2,state_00,config,&this_00->super_DiskInterface);
                pTVar1 = g_current_test;
                iVar4 = Cleaner::CleanDead(&cleaner2,&log2.entries_);
                testing::Test::Check
                          (pTVar1,iVar4 == 0,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/clean_test.cc"
                           ,0x20a,"0 == cleaner2.CleanDead(log2.entries())");
                testing::Test::Check
                          (g_current_test,cleaner2.cleaned_files_count_ == 1,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/clean_test.cc"
                           ,0x20b,"1 == cleaner2.cleaned_files_count()");
                testing::Test::Check
                          (g_current_test,
                           *(size_t *)
                            ((long)&(this->super_CleanDeadTest).super_CleanTest.fs_.files_removed_.
                                    _M_t._M_impl.super__Rb_tree_header + 0x20) == 1,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/clean_test.cc"
                           ,0x20c,"1u == fs_.files_removed_.size()");
                pTVar1 = g_current_test;
                bVar2 = std::operator==("out1",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                *)(*(_Base_ptr *)
                                                    ((long)&(this->super_CleanDeadTest).
                                                            super_CleanTest.fs_.files_removed_._M_t.
                                                            _M_impl.super__Rb_tree_header + 0x10) +
                                                  1));
                testing::Test::Check
                          (pTVar1,bVar2,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/clean_test.cc"
                           ,0x20d,"\"out1\" == *(fs_.files_removed_.begin())");
                pTVar1 = g_current_test;
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_378,"in",&local_379);
                TVar6 = VirtualFileSystem::Stat(this_00,&local_378,&err);
                testing::Test::Check
                          (pTVar1,TVar6 != 0,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/clean_test.cc"
                           ,0x20e,"0 != fs_.Stat(\"in\", &err)");
                std::__cxx11::string::~string((string *)&local_378);
                pTVar1 = g_current_test;
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_378,"out1",&local_379);
                TVar6 = VirtualFileSystem::Stat(this_00,&local_378,&err);
                testing::Test::Check
                          (pTVar1,TVar6 == 0,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/clean_test.cc"
                           ,0x20f,"0 == fs_.Stat(\"out1\", &err)");
                std::__cxx11::string::~string((string *)&local_378);
                pTVar1 = g_current_test;
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_378,"out2",&local_379);
                TVar6 = VirtualFileSystem::Stat(this_00,&local_378,&err);
                testing::Test::Check
                          (pTVar1,TVar6 != 0,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/clean_test.cc"
                           ,0x210,"0 != fs_.Stat(\"out2\", &err)");
                std::__cxx11::string::~string((string *)&local_378);
                pTVar1 = g_current_test;
                iVar4 = Cleaner::CleanDead(&cleaner2,&log2.entries_);
                testing::Test::Check
                          (pTVar1,iVar4 == 0,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/clean_test.cc"
                           ,0x213,"0 == cleaner2.CleanDead(log2.entries())");
                testing::Test::Check
                          (g_current_test,cleaner2.cleaned_files_count_ == 0,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/clean_test.cc"
                           ,0x214,"0 == cleaner2.cleaned_files_count()");
                testing::Test::Check
                          (g_current_test,
                           *(size_t *)
                            ((long)&(this->super_CleanDeadTest).super_CleanTest.fs_.files_removed_.
                                    _M_t._M_impl.super__Rb_tree_header + 0x20) == 1,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/clean_test.cc"
                           ,0x215,"1u == fs_.files_removed_.size()");
                pTVar1 = g_current_test;
                bVar2 = std::operator==("out1",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                *)(*(_Base_ptr *)
                                                    ((long)&(this->super_CleanDeadTest).
                                                            super_CleanTest.fs_.files_removed_._M_t.
                                                            _M_impl.super__Rb_tree_header + 0x10) +
                                                  1));
                testing::Test::Check
                          (pTVar1,bVar2,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/clean_test.cc"
                           ,0x216,"\"out1\" == *(fs_.files_removed_.begin())");
                pTVar1 = g_current_test;
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_378,"in",&local_379);
                TVar6 = VirtualFileSystem::Stat(this_00,&local_378,&err);
                testing::Test::Check
                          (pTVar1,TVar6 != 0,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/clean_test.cc"
                           ,0x217,"0 != fs_.Stat(\"in\", &err)");
                std::__cxx11::string::~string((string *)&local_378);
                pTVar1 = g_current_test;
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_378,"out1",&local_379);
                TVar6 = VirtualFileSystem::Stat(this_00,&local_378,&err);
                testing::Test::Check
                          (pTVar1,TVar6 == 0,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/clean_test.cc"
                           ,0x218,"0 == fs_.Stat(\"out1\", &err)");
                std::__cxx11::string::~string((string *)&local_378);
                pTVar1 = g_current_test;
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_378,"out2",&local_379);
                TVar6 = VirtualFileSystem::Stat(this_00,&local_378,&err);
                testing::Test::Check
                          (pTVar1,TVar6 != 0,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/clean_test.cc"
                           ,0x219,"0 != fs_.Stat(\"out2\", &err)");
                std::__cxx11::string::~string((string *)&local_378);
                BuildLog::Close(&log2);
                Cleaner::~Cleaner(&cleaner2);
                Cleaner::~Cleaner(&cleaner1);
              }
              else {
                g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
              }
              goto LAB_0013ed41;
            }
          }
          g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
        }
        else {
          g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
        }
LAB_0013ed41:
        BuildLog::~BuildLog(&log2);
      }
      else {
        g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
      }
      std::__cxx11::string::~string((string *)&err);
      BuildLog::~BuildLog(&log1);
      goto LAB_0013ed65;
    }
  }
  g_current_test->assertion_failures_ = iVar7 + 1;
LAB_0013ed65:
  State::~State(&state);
  return;
}

Assistant:

TEST_F(CleanDeadTest, CleanDead) {
  State state;
  ASSERT_NO_FATAL_FAILURE(AssertParse(&state,
"rule cat\n"
"  command = cat $in > $out\n"
"build out1: cat in\n"
"build out2: cat in\n"
));
  ASSERT_NO_FATAL_FAILURE(AssertParse(&state_,
"build out2: cat in\n"
));
  fs_.Create("in", "");
  fs_.Create("out1", "");
  fs_.Create("out2", "");

  BuildLog log1;
  string err;
  EXPECT_TRUE(log1.OpenForWrite(kTestFilename, *this, &err));
  ASSERT_EQ("", err);
  log1.RecordCommand(state.edges_[0], 15, 18);
  log1.RecordCommand(state.edges_[1], 20, 25);
  log1.Close();

  BuildLog log2;
  EXPECT_TRUE(log2.Load(kTestFilename, &err));
  ASSERT_EQ("", err);
  ASSERT_EQ(2u, log2.entries().size());
  ASSERT_TRUE(log2.LookupByOutput("out1"));
  ASSERT_TRUE(log2.LookupByOutput("out2"));

  // First use the manifest that describe how to build out1.
  Cleaner cleaner1(&state, config_, &fs_);
  EXPECT_EQ(0, cleaner1.CleanDead(log2.entries()));
  EXPECT_EQ(0, cleaner1.cleaned_files_count());
  EXPECT_EQ(0u, fs_.files_removed_.size());
  EXPECT_NE(0, fs_.Stat("in", &err));
  EXPECT_NE(0, fs_.Stat("out1", &err));
  EXPECT_NE(0, fs_.Stat("out2", &err));

  // Then use the manifest that does not build out1 anymore.
  Cleaner cleaner2(&state_, config_, &fs_);
  EXPECT_EQ(0, cleaner2.CleanDead(log2.entries()));
  EXPECT_EQ(1, cleaner2.cleaned_files_count());
  EXPECT_EQ(1u, fs_.files_removed_.size());
  EXPECT_EQ("out1", *(fs_.files_removed_.begin()));
  EXPECT_NE(0, fs_.Stat("in", &err));
  EXPECT_EQ(0, fs_.Stat("out1", &err));
  EXPECT_NE(0, fs_.Stat("out2", &err));

  // Nothing to do now.
  EXPECT_EQ(0, cleaner2.CleanDead(log2.entries()));
  EXPECT_EQ(0, cleaner2.cleaned_files_count());
  EXPECT_EQ(1u, fs_.files_removed_.size());
  EXPECT_EQ("out1", *(fs_.files_removed_.begin()));
  EXPECT_NE(0, fs_.Stat("in", &err));
  EXPECT_EQ(0, fs_.Stat("out1", &err));
  EXPECT_NE(0, fs_.Stat("out2", &err));
  log2.Close();
}